

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::Operation::execute(Operation *this,Thread *thread)

{
  int iVar1;
  Result RVar2;
  size_type sVar3;
  reference this_00;
  Event *pEVar4;
  SharedPtr<tcu::ThreadUtil::Event> local_40 [2];
  int local_20;
  byte local_19;
  int depNdx;
  bool success;
  Thread *thread_local;
  Operation *this_local;
  
  local_19 = 1;
  local_20 = 0;
  _depNdx = thread;
  thread_local = (Thread *)this;
  while( true ) {
    iVar1 = local_20;
    sVar3 = std::
            vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
            ::size(&this->m_deps);
    if ((int)sVar3 <= iVar1) break;
    this_00 = std::
              vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
              ::operator[](&this->m_deps,(long)local_20);
    pEVar4 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(this_00);
    RVar2 = Event::waitReady(pEVar4);
    if (RVar2 != RESULT_OK) {
      local_19 = 0;
    }
    local_20 = local_20 + 1;
  }
  if ((local_19 & 1) == 0) {
    pEVar4 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(&this->m_event);
    Event::setResult(pEVar4,RESULT_FAILED);
  }
  else {
    (*this->_vptr_Operation[2])(this,_depNdx);
    pEVar4 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(&this->m_event);
    Event::setResult(pEVar4,RESULT_OK);
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&this->m_deps);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(local_40);
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=(&this->m_event,local_40);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(local_40);
  return;
}

Assistant:

void Operation::execute (Thread& thread)
{
	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (m_deps[depNdx]->waitReady() != Event::RESULT_OK)
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			exec(thread);
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(Event::RESULT_FAILED);
			throw;
		}

		m_event->setResult(Event::RESULT_OK);
	}
	else
		// Some dependencies failed
		m_event->setResult(Event::RESULT_FAILED);

	// Release resources
	m_deps.clear();
	m_event = SharedPtr<Event>();
}